

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::SetTypeName
          (BinaryReaderIR *this,Index index,string_view name)

{
  Module *pMVar1;
  bool bVar2;
  size_type sVar3;
  reference ppTVar4;
  string_view name_00;
  Binding local_b0;
  BinaryReaderIR *local_88;
  size_t local_80;
  string local_78;
  undefined1 local_58 [8];
  string dollar_name;
  TypeEntry *type;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderIR *)name._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  }
  else {
    sVar3 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::size
                      (&this->module_->types);
    if (index < sVar3) {
      ppTVar4 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::operator[]
                          (&this->module_->types,(ulong)index);
      dollar_name.field_2._8_8_ = *ppTVar4;
      pMVar1 = this->module_;
      local_88 = this_local;
      local_80 = name_local._M_len;
      name_00._M_str = (char *)dollar_name.field_2._8_8_;
      name_00._M_len = name_local._M_len;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)this_local,name_00);
      GetUniqueName((string *)local_58,this,&pMVar1->type_bindings,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::operator=
                ((string *)(dollar_name.field_2._8_8_ + 0x28),(string *)local_58);
      pMVar1 = this->module_;
      Binding::Binding(&local_b0,index);
      std::
      unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
      ::emplace<std::__cxx11::string&,wabt::Binding>
                ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&pMVar1->type_bindings,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_b0);
      Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
      std::__cxx11::string::~string((string *)local_58);
    }
    else {
      PrintError(this,"invalid type index: %u",(ulong)index);
      Result::Result((Result *)((long)&name_local._M_str + 4),Error);
    }
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::SetTypeName(Index index, std::string_view name) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (index >= module_->types.size()) {
    PrintError("invalid type index: %" PRIindex, index);
    return Result::Error;
  }
  TypeEntry* type = module_->types[index];
  std::string dollar_name =
      GetUniqueName(&module_->type_bindings, MakeDollarName(name));
  type->name = dollar_name;
  module_->type_bindings.emplace(dollar_name, Binding(index));
  return Result::Ok;
}